

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

void Nwk_ManPrintFanioNew(Nwk_Man_t *pNtk)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  char Buffer [100];
  void *local_d0;
  void *local_c8;
  double local_a8;
  char local_98 [104];
  
  pVVar2 = pNtk->vObjs;
  if ((long)pVVar2->nSize < 1) {
    uVar14 = 0;
    dVar16 = 0.0;
    local_a8 = 0.0;
    uVar15 = 0;
  }
  else {
    lVar10 = 0;
    iVar12 = 0;
    iVar13 = 0;
    uVar15 = 0;
    uVar14 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar10];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x20) & 7) == 3)) {
        uVar6 = *(uint *)((long)pvVar3 + 0x3c);
        uVar7 = *(uint *)((long)pvVar3 + 0x40);
        iVar13 = iVar13 + uVar6;
        iVar12 = iVar12 + uVar7;
        if ((int)uVar14 <= (int)uVar6) {
          uVar14 = uVar6;
        }
        if ((int)uVar15 <= (int)uVar7) {
          uVar15 = uVar7;
        }
      }
      lVar10 = lVar10 + 1;
    } while (pVVar2->nSize != lVar10);
    local_a8 = (double)iVar13;
    dVar16 = (double)iVar12;
  }
  uVar6 = uVar14;
  if (1 < uVar14) {
    uVar9 = 0;
    uVar6 = 0;
    uVar7 = uVar14 - 1;
    if (uVar7 != 0) {
      do {
        uVar6 = uVar9 + 1;
        bVar5 = 9 < uVar7;
        uVar7 = uVar7 / 10;
        uVar9 = uVar6;
      } while (bVar5);
    }
  }
  uVar6 = uVar6 * 10 + 10;
  uVar7 = uVar15;
  if (1 < uVar15) {
    uVar8 = 0;
    uVar7 = 0;
    uVar9 = uVar15 - 1;
    if (uVar9 != 0) {
      do {
        uVar7 = uVar8 + 1;
        bVar5 = 9 < uVar9;
        uVar9 = uVar9 / 10;
        uVar8 = uVar7;
      } while (bVar5);
    }
  }
  uVar7 = uVar7 * 10 + 10;
  if ((int)uVar7 < (int)uVar6) {
    uVar7 = uVar6;
  }
  uVar6 = 0x10;
  if (0xe < uVar7 - 1) {
    uVar6 = uVar7;
  }
  if (uVar6 == 0) {
    local_c8 = (void *)0x0;
  }
  else {
    local_c8 = malloc((long)(int)uVar6 * 4);
  }
  local_d0 = (void *)0x0;
  memset(local_c8,0,(long)(int)uVar7 << 2);
  if (uVar6 != 0) {
    local_d0 = malloc((long)(int)uVar6 << 2);
  }
  memset(local_d0,0,(long)(int)uVar7 << 2);
  if (0 < pVVar2->nSize) {
    ppvVar4 = pVVar2->pArray;
    lVar10 = 0;
    do {
      pvVar3 = ppvVar4[lVar10];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x20) & 7) == 3)) {
        uVar6 = *(uint *)((long)pvVar3 + 0x3c);
        uVar9 = *(uint *)((long)pvVar3 + 0x40);
        if ((int)uVar6 < 10) {
          if ((int)uVar6 < 0) goto LAB_0049c0de;
LAB_0049be27:
          if ((int)uVar7 <= (int)uVar6) goto LAB_0049c0de;
          piVar1 = (int *)((long)local_c8 + (ulong)uVar6 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if ((int)uVar6 < 100) {
            uVar6 = uVar6 / 10 + 10;
            goto LAB_0049be27;
          }
          if ((int)uVar6 < 1000) {
            uVar6 = uVar6 / 100 + 0x14;
            goto LAB_0049be27;
          }
          if ((int)uVar6 < 10000) {
            uVar6 = uVar6 / 1000 + 0x1e;
            goto LAB_0049be27;
          }
          if ((int)uVar6 < 100000) {
            uVar6 = uVar6 / 10000 + 0x28;
            goto LAB_0049be27;
          }
          if ((int)uVar6 < 1000000) {
            uVar6 = uVar6 / 100000 + 0x32;
            goto LAB_0049be27;
          }
          if ((int)uVar6 < 10000000) {
            uVar6 = uVar6 / 1000000 + 0x3c;
            goto LAB_0049be27;
          }
        }
        if ((int)uVar9 < 10) {
          if ((int)uVar9 < 0) goto LAB_0049c0de;
        }
        else if ((int)uVar9 < 100) {
          uVar9 = uVar9 / 10 + 10;
        }
        else if ((int)uVar9 < 1000) {
          uVar9 = uVar9 / 100 + 0x14;
        }
        else if ((int)uVar9 < 10000) {
          uVar9 = uVar9 / 1000 + 0x1e;
        }
        else if ((int)uVar9 < 100000) {
          uVar9 = uVar9 / 10000 + 0x28;
        }
        else if ((int)uVar9 < 1000000) {
          uVar9 = uVar9 / 100000 + 0x32;
        }
        else {
          if (9999999 < (int)uVar9) goto LAB_0049beee;
          uVar9 = uVar9 / 1000000 + 0x3c;
        }
        if ((int)uVar7 <= (int)uVar9) {
LAB_0049c0de:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)local_d0 + (ulong)uVar9 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_0049beee:
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar2->nSize);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if (0 < (int)uVar7) {
    uVar11 = 0;
    do {
      if ((*(int *)((long)local_c8 + uVar11 * 4) != 0) ||
         (*(int *)((long)local_d0 + uVar11 * 4) != 0)) {
        if (uVar11 < 10) {
          printf("%15d : ",uVar11 & 0xffffffff);
        }
        else {
          iVar12 = (int)((uVar11 & 0xffffffff) / 10) * -10;
          dVar18 = (double)(int)((uVar11 & 0xffffffff) / 10);
          dVar17 = pow(10.0,dVar18);
          dVar18 = pow(10.0,dVar18);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar11 + iVar12) * (int)dVar17),
                  (ulong)(((int)uVar11 + iVar12 + 1) * (int)dVar18 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_c8 + uVar11 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)local_d0 + uVar11 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  if (local_c8 != (void *)0x0) {
    free(local_c8);
  }
  if (local_d0 != (void *)0x0) {
    free(local_d0);
  }
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
         local_a8 / (double)pNtk->nObjs[3],dVar16 / (double)pNtk->nObjs[3],(ulong)uVar14,
         (ulong)uVar15);
  return;
}

Assistant:

void Nwk_ManPrintFanioNew( Nwk_Man_t * pNtk )
{
    char Buffer[100];
    Nwk_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
//        nFanouts = Nwk_NodeMffcSize(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Nwk_ManNodeNum(pNtk), 
        nFanoutsMax, 1.0*nFanoutsAll/Nwk_ManNodeNum(pNtk)  );
}